

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O1

int Psr_ManIsMapped(Psr_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Mio_Library_t *pLib;
  char *pName;
  Mio_Gate_t *pMVar5;
  long lVar6;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if ((pLib != (Mio_Library_t *)0x0) && (0 < (pNtk->vObjs).nSize)) {
    lVar6 = 0;
    do {
      piVar3 = (pNtk->vObjs).pArray;
      iVar1 = piVar3[lVar6];
      if (((long)iVar1 < 0) || (iVar2 = (pNtk->vBoxes).nSize, iVar2 <= iVar1)) {
LAB_003bcb1c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar4[iVar1] + -2;
      iVar1 = piVar3[lVar6];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if ((iVar1 < -3) || (iVar2 <= (int)(iVar1 + 3U))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Psr_BoxSignals_V._8_8_ = piVar4 + (iVar1 + 3U);
      if (*(int *)Psr_BoxSignals_V._8_8_ != 0) {
        if ((iVar1 < -1) || (iVar2 <= (int)(iVar1 + 1U))) goto LAB_003bcb1c;
        pName = Abc_NamStr(pNtk->pStrs,piVar4[iVar1 + 1U]);
        pMVar5 = Mio_LibraryReadGateByName(pLib,pName,(char *)0x0);
        if (pMVar5 != (Mio_Gate_t *)0x0) {
          return 1;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pNtk->vObjs).nSize);
  }
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Psr_ManIsMapped( Psr_Ntk_t * pNtk )
{
    Vec_Int_t * vSigs; int iBox;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
        return 0;
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            int NtkId = Psr_BoxNtk( pNtk, iBox );
            if ( Mio_LibraryReadGateByName(pLib, Psr_NtkStr(pNtk, NtkId), NULL) )
                return 1;
        }
    return 0;
}